

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLLoader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  bool local_19;
  GLADloadproc load_local;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    load_local._4_4_ = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      load_local._4_4_ = 0;
    }
    else {
      find_coreGL();
      load_GL_VERSION_1_0(load);
      load_GL_VERSION_1_1(load);
      load_GL_VERSION_1_2(load);
      load_GL_VERSION_1_3(load);
      load_GL_VERSION_1_4(load);
      load_GL_VERSION_1_5(load);
      load_GL_VERSION_2_0(load);
      load_GL_VERSION_2_1(load);
      load_GL_VERSION_3_0(load);
      load_GL_VERSION_3_1(load);
      load_GL_VERSION_3_2(load);
      iVar1 = find_extensionsGL();
      if (iVar1 == 0) {
        load_local._4_4_ = 0;
      }
      else {
        local_19 = GLVersion.major != 0 || GLVersion.minor != 0;
        load_local._4_4_ = (uint)local_19;
      }
    }
  }
  return load_local._4_4_;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);

	if (!find_extensionsGL()) return 0;
	return GLVersion.major != 0 || GLVersion.minor != 0;
}